

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS
ref_mpi_alltoallv(REF_MPI ref_mpi,void *send,REF_INT *send_size,void *recv,REF_INT *recv_size,
                 REF_INT n,REF_TYPE type)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  lVar2 = (long)ref_mpi->n;
  if (lVar2 == 1) {
    iVar1 = *send_size;
    lVar2 = (long)*recv_size;
    if (iVar1 == *recv_size) {
      if (type == 3) {
        uVar3 = (ulong)(uint)(iVar1 * n);
        if (iVar1 * n < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          *(undefined8 *)((long)recv + uVar5 * 8) = *(undefined8 *)((long)send + uVar5 * 8);
        }
        return 0;
      }
      if (type != 2) {
        if (type == 1) {
          for (lVar2 = 0; lVar2 < iVar1 * n; lVar2 = lVar2 + 1) {
            *(undefined4 *)((long)recv + lVar2 * 4) = *(undefined4 *)((long)send + lVar2 * 4);
            iVar1 = *send_size;
          }
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x2ae
               ,"ref_mpi_alltoallv",6,"data type");
        return 6;
      }
      uVar3 = (ulong)(uint)(iVar1 * n);
      if (iVar1 * n < 1) {
        uVar3 = 0;
      }
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined8 *)((long)recv + uVar5 * 8) = *(undefined8 *)((long)send + uVar5 * 8);
      }
      return 0;
    }
    lVar7 = (long)iVar1;
    pcVar6 = "without mpi, send and recv should match";
    uVar4 = 0x29f;
  }
  else {
    pcVar6 = "expected 1 part without mpi";
    lVar7 = 1;
    uVar4 = 0x29e;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar4,
         "ref_mpi_alltoallv",pcVar6,lVar7,lVar2);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_alltoallv(REF_MPI ref_mpi, void *send,
                                     REF_INT *send_size, void *recv,
                                     REF_INT *recv_size, REF_INT n,
                                     REF_TYPE type) {
#ifdef HAVE_MPI
  MPI_Datatype datatype;
  REF_INT *send_disp;
  REF_INT *recv_disp;
  REF_INT *send_size_n;
  REF_INT *recv_size_n;
  REF_INT part;

  if (ref_mpi_native_alltoallv(ref_mpi)) {
    RSS(ref_mpi_alltoallv_native(ref_mpi, send, send_size, recv, recv_size, n,
                                 type),
        "ref_mpi_alltoallv_native");
    return REF_SUCCESS;
  }

  ref_type_mpi_type(type, datatype);

  ref_malloc(send_size_n, ref_mpi_n(ref_mpi), REF_INT);
  each_ref_mpi_part(ref_mpi, part) {
    RAS(0 <= send_size[part], "negative send_size");
    RAS(ref_math_int_multipliable(n, send_size[part]),
        "int overflow send_size_n");
    send_size_n[part] = n * send_size[part];
  }

  ref_malloc(recv_size_n, ref_mpi_n(ref_mpi), REF_INT);
  each_ref_mpi_part(ref_mpi, part) {
    RAS(0 <= recv_size[part], "negative recv_size");
    RAS(ref_math_int_multipliable(n, recv_size[part]),
        "int overflow recv_size_n");
    recv_size_n[part] = n * recv_size[part];
  }

  ref_malloc(send_disp, ref_mpi_n(ref_mpi), REF_INT);
  send_disp[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    RAS(ref_math_int_addable(send_disp[part - 1], send_size_n[part - 1]),
        "int overflow send_disp");
    send_disp[part] = send_disp[part - 1] + send_size_n[part - 1];
  }

  ref_malloc(recv_disp, ref_mpi_n(ref_mpi), REF_INT);
  recv_disp[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    RAS(ref_math_int_addable(recv_disp[part - 1], recv_size_n[part - 1]),
        "int overflow recv_disp");
    recv_disp[part] = recv_disp[part - 1] + recv_size_n[part - 1];
  }

  MPI_Alltoallv(send, send_size_n, send_disp, datatype, recv, recv_size_n,
                recv_disp, datatype, ref_mpi_comm(ref_mpi));

  free(recv_disp);
  free(send_disp);
  free(recv_size_n);
  free(send_size_n);

  return REF_SUCCESS;
#else
  REF_INT i;
  REIS(1, ref_mpi_n(ref_mpi), "expected 1 part without mpi");
  REIS(send_size[0], recv_size[0], "without mpi, send and recv should match");
  switch (type) {
    case REF_INT_TYPE:
      for (i = 0; i < send_size[0] * n; i++)
        ((REF_INT *)recv)[i] = ((REF_INT *)send)[i];
      break;
    case REF_LONG_TYPE:
      for (i = 0; i < send_size[0] * n; i++)
        ((REF_LONG *)recv)[i] = ((REF_LONG *)send)[i];
      break;
    case REF_DBL_TYPE:
      for (i = 0; i < send_size[0] * n; i++)
        ((REF_DBL *)recv)[i] = ((REF_DBL *)send)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  return REF_SUCCESS;
#endif
}